

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::getInfo2(btGeneric6DofConstraint *this,btConstraintInfo2 *info)

{
  long in_RDI;
  btVector3 *unaff_retaddr;
  btTransform *in_stack_00000008;
  btTransform *in_stack_00000010;
  int in_stack_0000001c;
  int row_1;
  int row;
  btVector3 *angVelB;
  btVector3 *angVelA;
  btVector3 *linVelB;
  btVector3 *linVelA;
  btTransform *transB;
  btTransform *transA;
  btTransform *in_stack_00000068;
  int in_stack_00000074;
  btConstraintInfo2 *in_stack_00000078;
  btGeneric6DofConstraint *in_stack_00000080;
  btVector3 *in_stack_000000b0;
  btVector3 *in_stack_000000b8;
  btVector3 *in_stack_000000c0;
  
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x30));
  btRigidBody::getLinearVelocity(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getLinearVelocity(*(btRigidBody **)(in_RDI + 0x30));
  btRigidBody::getAngularVelocity(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getAngularVelocity(*(btRigidBody **)(in_RDI + 0x30));
  if ((*(byte *)(in_RDI + 0x52d) & 1) == 0) {
    setLinearLimits(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000068,
                    (btTransform *)this,(btVector3 *)info,in_stack_000000b0,in_stack_000000b8,
                    in_stack_000000c0);
    setAngularLimits((btGeneric6DofConstraint *)angVelB,_row_1,in_stack_0000001c,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr,(btVector3 *)transA,(btVector3 *)info,
                     (btVector3 *)this);
  }
  else {
    setAngularLimits((btGeneric6DofConstraint *)angVelB,_row_1,in_stack_0000001c,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr,(btVector3 *)transA,(btVector3 *)info,
                     (btVector3 *)this);
    setLinearLimits(in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000068,
                    (btTransform *)this,(btVector3 *)info,in_stack_000000b0,in_stack_000000b8,
                    in_stack_000000c0);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo2 (btConstraintInfo2* info)
{
	btAssert(!m_useSolveConstraintObsolete);

	const btTransform& transA = m_rbA.getCenterOfMassTransform();
	const btTransform& transB = m_rbB.getCenterOfMassTransform();
	const btVector3& linVelA = m_rbA.getLinearVelocity();
	const btVector3& linVelB = m_rbB.getLinearVelocity();
	const btVector3& angVelA = m_rbA.getAngularVelocity();
	const btVector3& angVelB = m_rbB.getAngularVelocity();

	if(m_useOffsetForConstraintFrame)
	{ // for stability better to solve angular limits first
		int row = setAngularLimits(info, 0,transA,transB,linVelA,linVelB,angVelA,angVelB);
		setLinearLimits(info, row, transA,transB,linVelA,linVelB,angVelA,angVelB);
	}
	else
	{ // leave old version for compatibility
		int row = setLinearLimits(info, 0, transA,transB,linVelA,linVelB,angVelA,angVelB);
		setAngularLimits(info, row,transA,transB,linVelA,linVelB,angVelA,angVelB);
	}

}